

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v8::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  undefined1 uVar1;
  int iVar2;
  type tVar3;
  size_t sVar4;
  uint32_t in_ESI;
  buffer<char> *in_RDI;
  basic_string_view<char> bVar5;
  buffer_appender<char> it;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *in_stack_fffffffffffffd68;
  appender *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  buffer<char> *in_stack_fffffffffffffd80;
  basic_string_view<char> *pbVar6;
  basic_string_view<char> *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdbc;
  bool in_stack_fffffffffffffdbf;
  size_t in_stack_fffffffffffffdc0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffdc8;
  basic_string_view<char> local_230;
  undefined8 local_220;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_218;
  anon_class_1_0_00000001 local_20a;
  undefined1 local_209;
  char *local_208;
  size_t local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  uint32_t local_1e4;
  long local_1e0;
  uint32_t local_1d4;
  buffer<char> *local_1d0;
  basic_string_view<char> local_1c8;
  undefined1 local_1b8 [40];
  undefined8 local_190;
  undefined1 *local_188;
  char *local_180;
  size_t local_178;
  undefined8 local_170;
  char *local_168;
  basic_string_view<char> *local_160;
  char *local_158;
  size_t sStack_150;
  undefined8 local_148;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_140;
  undefined1 *local_138;
  char **local_130;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> local_128;
  undefined8 local_108;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_100;
  undefined8 local_e8;
  char (*local_e0) [7];
  char *local_d8;
  int *local_d0;
  size_t sStack_c8;
  undefined8 local_c0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b8;
  undefined1 *local_b0;
  basic_string_view<char> *local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  undefined1 *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  int **local_50;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_30;
  undefined8 *local_28;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_8;
  
  local_1d4 = in_ESI;
  local_1d0 = in_RDI;
  buffer<char>::try_resize(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_1e0 = 8;
  local_1e4 = local_1d4;
  uVar1 = is_negative<int,_0>(local_1d4);
  if ((bool)uVar1) {
    local_1e4 = -local_1e4;
    local_1e0 = local_1e0 + 1;
  }
  iVar2 = count_digits(local_1e4);
  tVar3 = to_unsigned<int>(0);
  local_1e0 = local_1e0 + (ulong)tVar3;
  appender::back_insert_iterator(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  sVar4 = basic_string_view<char>::size(&local_1c8);
  if (sVar4 <= 500U - local_1e0) {
    local_1f8 = local_1f0;
    format_error_code::anon_class_1_0_00000001::operator()(&local_20a);
    local_130 = &local_208;
    local_138 = &local_209;
    bVar5 = v8::operator()((FMT_COMPILE_STRING *)0x241362);
    in_stack_fffffffffffffda8 = bVar5.data_;
    local_200 = bVar5.size_;
    local_208 = in_stack_fffffffffffffda8;
    check_format_string<fmt::v8::basic_string_view<char>_&,_const_char_(&)[3],_FMT_COMPILE_STRING,_0>
              ();
    local_148 = local_1f8;
    local_158 = local_208;
    sStack_150 = local_200;
    local_160 = &local_1c8;
    local_168 = ": ";
    local_170 = local_1f8;
    local_a0 = &local_158;
    local_180 = local_208;
    local_178 = local_200;
    local_98 = local_180;
    sStack_90 = local_178;
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>&,char_const(&)[3]>
              (in_stack_fffffffffffffd88,(char (*) [3])in_stack_fffffffffffffd80);
    local_78 = &local_190;
    local_80 = local_1b8;
    local_68 = 0xcd;
    local_190 = 0xcd;
    fmt.data_._4_2_ = in_stack_fffffffffffffdbc;
    fmt.data_._0_4_ = iVar2;
    fmt.data_._6_1_ = uVar1;
    fmt.data_._7_1_ = in_stack_fffffffffffffdbf;
    fmt.size_ = in_stack_fffffffffffffdc0;
    args.field_1._0_4_ = in_stack_fffffffffffffdb0;
    args.desc_ = (unsigned_long_long)in_stack_fffffffffffffda8;
    args.field_1._4_4_ = tVar3;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    local_188 = local_80;
    local_218.container =
         (buffer<char> *)
         vformat_to<fmt::v8::appender,_0>(in_stack_fffffffffffffdc8.container,fmt,args);
    local_140.container = local_218.container;
  }
  local_220 = local_1f0;
  format_error_code::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&stack0xfffffffffffffdce);
  pbVar6 = &local_230;
  local_b0 = &stack0xfffffffffffffdcf;
  local_a8 = pbVar6;
  bVar5 = v8::operator()((FMT_COMPILE_STRING *)0x241571);
  *pbVar6 = bVar5;
  check_format_string<const_char_(&)[7],_int_&,_FMT_COMPILE_STRING,_0>();
  local_c0 = local_220;
  local_d0 = (int *)local_230.data_;
  sStack_c8 = local_230.size_;
  local_d8 = "error ";
  local_e0 = (char (*) [7])&local_1d4;
  local_e8 = local_220;
  local_50 = &local_d0;
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[7],int&>
            (&local_128,(v8 *)"error ",local_e0,(int *)local_230.data_);
  local_28 = &local_108;
  local_30 = &local_128;
  local_18 = 0x1c;
  local_108 = 0x1c;
  fmt_00.data_._4_2_ = in_stack_fffffffffffffdbc;
  fmt_00.data_._0_4_ = iVar2;
  fmt_00.data_._6_1_ = uVar1;
  fmt_00.data_._7_1_ = in_stack_fffffffffffffdbf;
  fmt_00.size_ = in_stack_fffffffffffffdc0;
  args_00.field_1._0_4_ = in_stack_fffffffffffffdb0;
  args_00.desc_ = (unsigned_long_long)in_stack_fffffffffffffda8;
  args_00.field_1._4_4_ = tVar3;
  local_20 = local_30;
  local_10 = local_28;
  local_8 = local_30;
  local_100 = local_30;
  local_b8.container =
       (buffer<char> *)
       vformat_to<fmt::v8::appender,_0>(in_stack_fffffffffffffdc8.container,fmt_00,args_00);
  buffer<char>::size(local_1d0);
  ignore_unused<bool,char[1]>((bool *)&stack0xfffffffffffffdbf,(char (*) [1])0x2502bd);
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}